

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O2

string * __thiscall
cmCTestGIT::FindTopDir_abi_cxx11_(string *__return_storage_ptr__,cmCTestGIT *this)

{
  bool bVar1;
  string cdup;
  char *git_rev_parse [4];
  string local_b8;
  OutputLogger rev_parse_err;
  OneLineParser rev_parse_out;
  
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory);
  git_rev_parse[0] = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  git_rev_parse[1] = "rev-parse";
  git_rev_parse[2] = "--show-cdup";
  git_rev_parse[3] = (char *)0x0;
  cdup._M_dataplus._M_p = (pointer)&cdup.field_2;
  cdup._M_string_length = 0;
  cdup.field_2._M_local_buf[0] = '\0';
  OneLineParser::OneLineParser(&rev_parse_out,this,"rev-parse-out> ",&cdup);
  cmProcessTools::OutputLogger::OutputLogger
            (&rev_parse_err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"rev-parse-err> ");
  bVar1 = cmCTestVC::RunChild((cmCTestVC *)this,git_rev_parse,(OutputParser *)&rev_parse_out,
                              (OutputParser *)&rev_parse_err,(char *)0x0,UTF8);
  if (bVar1 && cdup._M_string_length != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    cmsys::SystemTools::CollapseFullPath(&local_b8,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  cmProcessTools::LineParser::~LineParser(&rev_parse_err.super_LineParser);
  cmProcessTools::LineParser::~LineParser(&rev_parse_out.super_LineParser);
  std::__cxx11::string::~string((string *)&cdup);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestGIT::FindTopDir()
{
  std::string top_dir = this->SourceDirectory;

  // Run "git rev-parse --show-cdup" to locate the top of the tree.
  const char* git = this->CommandLineTool.c_str();
  char const* git_rev_parse[] = { git, "rev-parse", "--show-cdup", nullptr };
  std::string cdup;
  OneLineParser rev_parse_out(this, "rev-parse-out> ", cdup);
  OutputLogger rev_parse_err(this->Log, "rev-parse-err> ");
  if (this->RunChild(git_rev_parse, &rev_parse_out, &rev_parse_err, nullptr,
                     cmProcessOutput::UTF8) &&
      !cdup.empty()) {
    top_dir += "/";
    top_dir += cdup;
    top_dir = cmSystemTools::CollapseFullPath(top_dir);
  }
  return top_dir;
}